

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O2

void BrotliSplitBlockLiteralsFromStored
               (MemoryManager *m,Command_conflict *cmds,size_t num_commands,size_t pos,size_t mask,
               BlockSplit *literal_split,BlockSplitFromDecoder *literal_split_decoder,
               size_t *cur_block_decoder)

{
  uint8_t *__dest;
  ulong uVar1;
  uint32_t *puVar2;
  void *pvVar3;
  ulong uVar4;
  size_t sVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  uint32_t uVar10;
  long lVar11;
  size_t sVar12;
  uint uVar13;
  
  uVar8 = literal_split->types_alloc_size;
  uVar1 = literal_split_decoder->num_blocks;
  if (uVar8 < uVar1) {
    if (uVar8 == 0) {
      uVar8 = uVar1;
    }
    do {
      uVar4 = uVar8;
      uVar8 = uVar4 * 2;
    } while (uVar4 < uVar1);
    __dest = (uint8_t *)BrotliAllocate(m,uVar4);
    if (literal_split->types_alloc_size != 0) {
      memcpy(__dest,literal_split->types,literal_split->types_alloc_size);
    }
    BrotliFree(m,literal_split->types);
    literal_split->types = __dest;
    literal_split->types_alloc_size = uVar4;
    uVar1 = literal_split_decoder->num_blocks;
  }
  uVar8 = literal_split->lengths_alloc_size;
  if (uVar8 < uVar1) {
    if (uVar8 == 0) {
      uVar8 = uVar1;
    }
    do {
      uVar4 = uVar8;
      uVar8 = uVar4 * 2;
    } while (uVar4 < uVar1);
    puVar2 = (uint32_t *)BrotliAllocate(m,uVar4 * 4);
    if (literal_split->lengths_alloc_size != 0) {
      memcpy(puVar2,literal_split->lengths,literal_split->lengths_alloc_size << 2);
    }
    BrotliFree(m,literal_split->lengths);
    literal_split->lengths = puVar2;
    literal_split->lengths_alloc_size = uVar4;
  }
  literal_split->num_types = 0;
  literal_split->num_blocks = 0;
  sVar12 = literal_split_decoder->num_types;
  pvVar3 = malloc(sVar12 * 4);
  for (sVar5 = 0; sVar12 != sVar5; sVar5 = sVar5 + 1) {
    *(undefined4 *)((long)pvVar3 + sVar5 * 4) = 0xffffffff;
  }
  lVar11 = 0;
  iVar7 = 0;
LAB_001221f4:
  uVar8 = (ulong)iVar7;
  do {
    uVar10 = (uint32_t)lVar11;
    if (num_commands <= uVar8) {
      if (lVar11 != 0) {
        uVar13 = *(uint *)((long)pvVar3 +
                          (ulong)literal_split_decoder->types[*cur_block_decoder] * 4);
        if (uVar13 == 0xffffffff) {
          uVar13 = (uint)literal_split->num_types;
        }
        sVar12 = literal_split->num_blocks;
        if ((sVar12 == 0) || (uVar13 != literal_split->types[sVar12 - 1])) {
          literal_split->types[sVar12] = (uint8_t)uVar13;
          sVar12 = literal_split->num_blocks;
          literal_split->lengths[sVar12] = uVar10;
          uVar13 = (uint)literal_split->num_types;
          bVar9 = literal_split->types[sVar12] + 1;
          uVar6 = (uint)bVar9;
          if (bVar9 < (byte)uVar13) {
            uVar6 = uVar13;
          }
          literal_split->num_types = (ulong)(uVar6 & 0xff);
          literal_split->num_blocks = sVar12 + 1;
        }
        else {
          literal_split->lengths[sVar12 - 1] = literal_split->lengths[sVar12 - 1] + uVar10;
        }
      }
      return;
    }
    puVar2 = literal_split_decoder->positions_end;
    sVar12 = *cur_block_decoder;
    if (puVar2[sVar12] <= pos) {
      if (lVar11 != 0) {
        uVar13 = *(uint *)((long)pvVar3 + (ulong)literal_split_decoder->types[sVar12] * 4);
        if (uVar13 == 0xffffffff) {
          uVar13 = (uint)literal_split->num_types;
          *(uint *)((long)pvVar3 + (ulong)literal_split_decoder->types[sVar12] * 4) = uVar13;
        }
        sVar5 = literal_split->num_blocks;
        if ((sVar5 == 0) || (uVar13 != literal_split->types[sVar5 - 1])) {
          literal_split->types[sVar5] = (uint8_t)uVar13;
          sVar12 = literal_split->num_blocks;
          literal_split->lengths[sVar12] = uVar10;
          uVar13 = (uint)literal_split->num_types;
          bVar9 = literal_split->types[sVar12] + 1;
          uVar1 = (ulong)bVar9;
          if (bVar9 < (byte)uVar13) {
            uVar1 = (ulong)uVar13;
          }
          literal_split->num_types = uVar1 & 0xff;
          literal_split->num_blocks = sVar12 + 1;
          sVar12 = *cur_block_decoder;
          puVar2 = literal_split_decoder->positions_end;
        }
        else {
          literal_split->lengths[sVar5 - 1] = literal_split->lengths[sVar5 - 1] + uVar10;
        }
      }
      sVar12 = sVar12 + 1;
      *cur_block_decoder = sVar12;
      lVar11 = 0;
    }
    while( true ) {
      uVar1 = (ulong)puVar2[sVar12];
      if (pos <= uVar1 && uVar1 - pos != 0) break;
      sVar12 = sVar12 + 1;
      *cur_block_decoder = sVar12;
    }
    uVar13 = literal_split_decoder->positions_begin[sVar12];
    uVar6 = cmds[uVar8].insert_len_;
    uVar4 = pos + uVar6;
    if (pos < uVar13) {
      if (uVar4 <= uVar1) break;
      lVar11 = lVar11 + (ulong)(puVar2[sVar12] - uVar13);
      if (lVar11 != 0) {
        uVar13 = *(uint *)((long)pvVar3 + (ulong)literal_split_decoder->types[sVar12] * 4);
        if (uVar13 == 0xffffffff) {
          uVar13 = (uint)literal_split->num_types;
          *(uint *)((long)pvVar3 + (ulong)literal_split_decoder->types[sVar12] * 4) = uVar13;
        }
        sVar5 = literal_split->num_blocks;
        uVar10 = (uint32_t)lVar11;
        if ((sVar5 == 0) || (uVar13 != literal_split->types[sVar5 - 1])) {
          literal_split->types[sVar5] = (uint8_t)uVar13;
          sVar12 = literal_split->num_blocks;
          literal_split->lengths[sVar12] = uVar10;
LAB_0012239c:
          uVar13 = (uint)literal_split->num_types;
          bVar9 = literal_split->types[sVar12] + 1;
          uVar1 = (ulong)bVar9;
          if (bVar9 < (byte)uVar13) {
            uVar1 = (ulong)uVar13;
          }
          literal_split->num_types = uVar1 & 0xff;
          literal_split->num_blocks = sVar12 + 1;
          sVar12 = *cur_block_decoder;
        }
        else {
          literal_split->lengths[sVar5 - 1] = literal_split->lengths[sVar5 - 1] + uVar10;
        }
      }
    }
    else {
      if (uVar4 <= uVar1) {
        lVar11 = lVar11 + (ulong)uVar6;
        goto LAB_001223e0;
      }
      lVar11 = (uVar1 - pos) + lVar11;
      if (lVar11 != 0) {
        uVar13 = *(uint *)((long)pvVar3 + (ulong)literal_split_decoder->types[sVar12] * 4);
        if (uVar13 == 0xffffffff) {
          uVar13 = (uint)literal_split->num_types;
          *(uint *)((long)pvVar3 + (ulong)literal_split_decoder->types[sVar12] * 4) = uVar13;
        }
        sVar5 = literal_split->num_blocks;
        uVar10 = (uint32_t)lVar11;
        if ((sVar5 == 0) || (uVar13 != literal_split->types[sVar5 - 1])) {
          literal_split->types[sVar5] = (uint8_t)uVar13;
          sVar12 = literal_split->num_blocks;
          literal_split->lengths[sVar12] = uVar10;
          goto LAB_0012239c;
        }
        literal_split->lengths[sVar5 - 1] = literal_split->lengths[sVar5 - 1] + uVar10;
      }
    }
    *cur_block_decoder = sVar12 + 1;
    lVar11 = 0;
  } while( true );
  lVar11 = (lVar11 - (ulong)uVar13) + uVar4;
LAB_001223e0:
  iVar7 = iVar7 + 1;
  pos = pos + ((cmds[uVar8].copy_len_ & 0x1ffffff) + uVar6);
  goto LAB_001221f4;
}

Assistant:

void BrotliSplitBlockLiteralsFromStored(
                            MemoryManager* m,
                            const Command* cmds,
                            const size_t num_commands,
                            const size_t pos,
                            const size_t mask,
                            BlockSplit* literal_split,
                            const BlockSplitFromDecoder* literal_split_decoder,
                            size_t* cur_block_decoder) {
  BROTLI_ENSURE_CAPACITY(
      m, uint8_t, literal_split->types, literal_split->types_alloc_size,
      literal_split_decoder->num_blocks);
  BROTLI_ENSURE_CAPACITY(
      m, uint32_t, literal_split->lengths, literal_split->lengths_alloc_size,
      literal_split_decoder->num_blocks);
  size_t cur_pos = pos;
  literal_split->num_blocks = 0;
  literal_split->num_types = 0;
  size_t cur_length = 0;
  /* Mapping of the types from decoder (they increase with each metablock)
     to the appropriate types */
  int* types_mapping = (int*)malloc(sizeof(int) *
                                            literal_split_decoder->num_types);
  for (int i = 0; i < literal_split_decoder->num_types; ++i) {
    types_mapping[i] = -1;
  }

  int i = 0;
  while (i < num_commands) {
    /* Considering an interval of literals for current command:
       from cur_pos to cur_pos + insert_len*/

    /* If current literals interval lies after the current block
      that means we've finished the current block.
      If some literals have fallen inside current block before
      then need to save it*/
    if (cur_pos >= literal_split_decoder->positions_end[*cur_block_decoder]) {
      if (cur_length > 0) {
        /* If we haven't seen this decoder block type before
          then save a mapping of it to a current num_types */
        if (types_mapping[literal_split_decoder->types[*cur_block_decoder]] == -1) {
          types_mapping[literal_split_decoder->types[*cur_block_decoder]] =
                                                      literal_split->num_types;
        }
        /* If the same block type as for a previous block then merge them */
        if (literal_split->num_blocks > 0 &&
            types_mapping[literal_split_decoder->types[*cur_block_decoder]] ==
              literal_split->types[literal_split->num_blocks - 1]) {
          literal_split->lengths[literal_split->num_blocks - 1] += cur_length;
        } else {
          /* Map the decoder block type to an appropriate type */
          literal_split->types[literal_split->num_blocks] =
              types_mapping[literal_split_decoder->types[*cur_block_decoder]];
          literal_split->lengths[literal_split->num_blocks] = cur_length;
          literal_split->num_types = BROTLI_MAX(uint8_t, literal_split->num_types,
                            literal_split->types[literal_split->num_blocks] + 1);
          literal_split->num_blocks++;
        }
        cur_length = 0;
      }
      (*cur_block_decoder)++;

    }
    /* Go through decoder blocks until a block with cur_pos inside is found */
    while (cur_pos >= literal_split_decoder->positions_end[*cur_block_decoder]) {
      (*cur_block_decoder)++;
    }
    /* Means that the first part of literals interval is already saved
       as a part of the previous block,
       now only need to look at the second part */
    if (cur_pos < literal_split_decoder->positions_begin[*cur_block_decoder]) {
      /* If literals interval ends inside the current block
         then increase an amount of literals for the current block */
      if (cur_pos + cmds[i].insert_len_ <=
                  literal_split_decoder->positions_end[*cur_block_decoder]) {
        cur_length += cur_pos + cmds[i].insert_len_ -
                  literal_split_decoder->positions_begin[*cur_block_decoder];
        cur_pos += cmds[i].insert_len_ + CommandCopyLen(&cmds[i]);
        i++;
      }
      /* If literals interval ends after the current block
         then we've finished the block and need to save it */
      else {
        cur_length += literal_split_decoder->positions_end[*cur_block_decoder] -
                      literal_split_decoder->positions_begin[*cur_block_decoder];
        if (cur_length > 0) {
          if (types_mapping[literal_split_decoder->types[*cur_block_decoder]] == -1) {
            types_mapping[literal_split_decoder->types[*cur_block_decoder]] =
                                                        literal_split->num_types;
          }
          /* If the same block type as for a previous block then merge them */
          if (literal_split->num_blocks > 0 &&
              types_mapping[literal_split_decoder->types[*cur_block_decoder]] ==
                literal_split->types[literal_split->num_blocks - 1]) {
            literal_split->lengths[literal_split->num_blocks - 1] += cur_length;
          } else {
            literal_split->types[literal_split->num_blocks] =
                types_mapping[literal_split_decoder->types[*cur_block_decoder]];
            literal_split->lengths[literal_split->num_blocks] = cur_length;
            literal_split->num_types = BROTLI_MAX(uint8_t, literal_split->num_types,
                              literal_split->types[literal_split->num_blocks] + 1);
            literal_split->num_blocks++;
          }
          cur_length = 0;
        }
        (*cur_block_decoder)++;
      }
    }
    /* If literals interval starts inside the current block
       then look where it ends*/
    else if (cur_pos < literal_split_decoder->positions_end[*cur_block_decoder]) {
      /* If literals interval ends inside the current block
         then increase an amount of literals for the current block */
      if (cur_pos + cmds[i].insert_len_ <=
                literal_split_decoder->positions_end[*cur_block_decoder]) {
        cur_length += cmds[i].insert_len_;
        cur_pos += cmds[i].insert_len_ + CommandCopyLen(&cmds[i]);
        i++;
      }
      /* If literals interval ends after the current block
         then we've finished the block and need to save it */
      else {
        cur_length += literal_split_decoder->positions_end[*cur_block_decoder]
                                                                      - cur_pos;
        if (cur_length > 0) {
          if (types_mapping[literal_split_decoder->types[*cur_block_decoder]] == -1) {
            types_mapping[literal_split_decoder->types[*cur_block_decoder]] =
                                                        literal_split->num_types;
          }
          /* If the same block type as for a previous block then merge them */
          if (literal_split->num_blocks > 0 &&
              types_mapping[literal_split_decoder->types[*cur_block_decoder]] ==
                literal_split->types[literal_split->num_blocks - 1]) {
            literal_split->lengths[literal_split->num_blocks - 1] += cur_length;
          } else {
            literal_split->types[literal_split->num_blocks] =
                    types_mapping[literal_split_decoder->types[*cur_block_decoder]];
            literal_split->lengths[literal_split->num_blocks] = cur_length;
            literal_split->num_types = BROTLI_MAX(uint8_t, literal_split->num_types,
                              literal_split->types[literal_split->num_blocks] + 1);
            literal_split->num_blocks++;
          }
          cur_length = 0;
        }
        (*cur_block_decoder)++;
      }
    }
  }
  /* Save the last in metablock block */
  if (cur_length > 0) {
    if (types_mapping[literal_split_decoder->types[*cur_block_decoder]] == -1) {
      types_mapping[literal_split_decoder->types[*cur_block_decoder]] =
                                                        literal_split->num_types;
    }
    /* If the same block type as for a previous block then merge them */
    if (literal_split->num_blocks > 0 &&
        types_mapping[literal_split_decoder->types[*cur_block_decoder]] ==
          literal_split->types[literal_split->num_blocks - 1]) {
      literal_split->lengths[literal_split->num_blocks - 1] += cur_length;
    } else {
      literal_split->types[literal_split->num_blocks] =
                  types_mapping[literal_split_decoder->types[*cur_block_decoder]];
      literal_split->lengths[literal_split->num_blocks] = cur_length;
      literal_split->num_types = BROTLI_MAX(uint8_t, literal_split->num_types,
                              literal_split->types[literal_split->num_blocks] + 1);
      literal_split->num_blocks++;
    }
  }
}